

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch.cc
# Opt level: O2

vector<Patch::Change,_std::allocator<Patch::Change>_> * __thiscall
Patch::get_changes_in_range<Patch::OldCoordinates>
          (vector<Patch::Change,_std::allocator<Patch::Change>_> *__return_storage_ptr__,Patch *this
          ,Point start,Point end,bool inclusive)

{
  uint32_t uVar1;
  uint32_t uVar2;
  Node *pNVar3;
  Text *pTVar4;
  Text *pTVar5;
  pointer pPVar6;
  pointer pPVar7;
  bool bVar8;
  uint32_t uVar9;
  uint32_t uVar10;
  Point PVar11;
  Point PVar12;
  pointer ppNVar13;
  uint32_t uVar14;
  value_type pNVar15;
  uint32_t uVar16;
  size_type __new_size;
  initializer_list<Patch::PositionStackEntry> __l;
  value_type local_128;
  Point node_end;
  Point node_new_start;
  _Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_> local_108;
  vector<Patch::Change,_std::allocator<Patch::Change>_> *local_e8;
  vector<Patch::PositionStackEntry,_std::allocator<Patch::PositionStackEntry>_> left_ancestor_stack;
  size_type local_c0;
  Point node_start;
  Point end_local;
  Point start_local;
  Point node_old_start;
  Node *local_88;
  value_type local_70;
  
  (__return_storage_ptr__->super__Vector_base<Patch::Change,_std::allocator<Patch::Change>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Patch::Change,_std::allocator<Patch::Change>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Patch::Change,_std::allocator<Patch::Change>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_128 = this->root;
  local_108._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_108._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_108._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_e8 = __return_storage_ptr__;
  end_local = end;
  start_local = start;
  PositionStackEntry::PositionStackEntry((PositionStackEntry *)&local_70);
  __l._M_len = 1;
  __l._M_array = (iterator)&local_70;
  std::vector<Patch::PositionStackEntry,_std::allocator<Patch::PositionStackEntry>_>::vector
            (&left_ancestor_stack,__l,(allocator_type *)&node_old_start);
  local_c0 = 0;
  __new_size = 0;
  local_88 = (Node *)0x0;
  for (; pPVar6 = left_ancestor_stack.
                  super__Vector_base<Patch::PositionStackEntry,_std::allocator<Patch::PositionStackEntry>_>
                  ._M_impl.super__Vector_impl_data._M_finish, local_128 != (Node *)0x0;
      local_128 = local_128->left) {
    node_old_start =
         Point::traverse(&left_ancestor_stack.
                          super__Vector_base<Patch::PositionStackEntry,_std::allocator<Patch::PositionStackEntry>_>
                          ._M_impl.super__Vector_impl_data._M_finish[-1].old_end,
                         &local_128->old_distance_from_left_ancestor);
    node_new_start =
         Point::traverse(&pPVar6[-1].new_end,&local_128->new_distance_from_left_ancestor);
    PVar11 = Point::traverse(&node_old_start,&local_128->old_extent);
    PVar12 = Point::traverse(&node_new_start,&local_128->new_extent);
    node_end = PVar11;
    bVar8 = Point::operator>(&node_end,&start_local);
    if ((bVar8) || ((inclusive && (bVar8 = Point::operator==(&node_end,&start_local), bVar8)))) {
      __new_size = (long)local_108._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_108._M_impl.super__Vector_impl_data._M_start >> 3;
      local_c0 = ((long)left_ancestor_stack.
                        super__Vector_base<Patch::PositionStackEntry,_std::allocator<Patch::PositionStackEntry>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)left_ancestor_stack.
                       super__Vector_base<Patch::PositionStackEntry,_std::allocator<Patch::PositionStackEntry>_>
                       ._M_impl.super__Vector_impl_data._M_start) / 0x18;
      local_88 = local_128;
      if (local_128->left == (Node *)0x0) break;
      std::vector<Patch::Node_*,_std::allocator<Patch::Node_*>_>::push_back
                ((vector<Patch::Node_*,_std::allocator<Patch::Node_*>_> *)&local_108,&local_128);
    }
    else {
      if (local_128->right == (Node *)0x0) break;
      if (local_128->left == (Node *)0x0) {
        uVar16 = 0;
      }
      else {
        uVar16 = local_128->left->old_subtree_text_size;
      }
      uVar1 = pPVar6[-1].total_old_text_size;
      uVar9 = Node::old_text_size(local_128);
      if (local_128->left == (Node *)0x0) {
        uVar14 = 0;
      }
      else {
        uVar14 = local_128->left->new_subtree_text_size;
      }
      uVar2 = pPVar6[-1].total_new_text_size;
      uVar10 = Node::new_text_size(local_128);
      local_70.new_start.column = uVar14 + uVar2 + uVar10;
      local_70.new_start.row = uVar16 + uVar1 + uVar9;
      local_70.old_start = PVar11;
      local_70.old_end = PVar12;
      std::vector<Patch::PositionStackEntry,_std::allocator<Patch::PositionStackEntry>_>::
      emplace_back<Patch::PositionStackEntry>(&left_ancestor_stack,(PositionStackEntry *)&local_70);
      std::vector<Patch::Node_*,_std::allocator<Patch::Node_*>_>::push_back
                ((vector<Patch::Node_*,_std::allocator<Patch::Node_*>_> *)&local_108,&local_128);
      local_128 = (value_type)&local_128->right;
    }
  }
  local_128 = local_88;
  std::vector<Patch::Node_*,_std::allocator<Patch::Node_*>_>::resize
            ((vector<Patch::Node_*,_std::allocator<Patch::Node_*>_> *)&local_108,__new_size);
  std::vector<Patch::PositionStackEntry,_std::allocator<Patch::PositionStackEntry>_>::resize
            (&left_ancestor_stack,local_c0);
  pPVar6 = left_ancestor_stack.
           super__Vector_base<Patch::PositionStackEntry,_std::allocator<Patch::PositionStackEntry>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  do {
    left_ancestor_stack.
    super__Vector_base<Patch::PositionStackEntry,_std::allocator<Patch::PositionStackEntry>_>.
    _M_impl.super__Vector_impl_data._M_finish = pPVar6;
    if (local_128 == (Node *)0x0) {
LAB_00159c55:
      std::_Vector_base<Patch::PositionStackEntry,_std::allocator<Patch::PositionStackEntry>_>::
      ~_Vector_base(&left_ancestor_stack.
                     super__Vector_base<Patch::PositionStackEntry,_std::allocator<Patch::PositionStackEntry>_>
                   );
      std::_Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>::~_Vector_base(&local_108);
      return local_e8;
    }
    node_new_start =
         Point::traverse(&pPVar6[-1].old_end,&local_128->old_distance_from_left_ancestor);
    node_end = Point::traverse(&pPVar6[-1].new_end,&local_128->new_distance_from_left_ancestor);
    node_start = node_new_start;
    bVar8 = Point::operator>(&node_start,&end_local);
    if ((bVar8) || ((!inclusive && (bVar8 = Point::operator==(&node_start,&end_local), bVar8))))
    goto LAB_00159c55;
    PVar11 = Point::traverse(&node_new_start,&local_128->old_extent);
    PVar12 = Point::traverse(&node_end,&local_128->new_extent);
    pTVar4 = (local_128->old_text)._M_t.super___uniq_ptr_impl<Text,_std::default_delete<Text>_>._M_t
             .super__Tuple_impl<0UL,_Text_*,_std::default_delete<Text>_>.
             super__Head_base<0UL,_Text_*,_false>._M_head_impl;
    pTVar5 = (local_128->new_text)._M_t.super___uniq_ptr_impl<Text,_std::default_delete<Text>_>._M_t
             .super__Tuple_impl<0UL,_Text_*,_std::default_delete<Text>_>.
             super__Head_base<0UL,_Text_*,_false>._M_head_impl;
    local_70.old_text_size = Node::old_text_size(local_128);
    local_70.preceding_old_text_size = pPVar6[-1].total_old_text_size;
    pNVar3 = local_128->left;
    if (pNVar3 == (Node *)0x0) {
      local_70.preceding_new_text_size = 0;
    }
    else {
      local_70.preceding_old_text_size =
           local_70.preceding_old_text_size + pNVar3->old_subtree_text_size;
      local_70.preceding_new_text_size = pNVar3->new_subtree_text_size;
    }
    local_70.preceding_new_text_size =
         local_70.preceding_new_text_size + pPVar6[-1].total_new_text_size;
    local_70.old_start = node_new_start;
    local_70.new_start = node_end;
    local_70.old_end = PVar11;
    local_70.new_end = PVar12;
    local_70.old_text = pTVar4;
    local_70.new_text = pTVar5;
    std::vector<Patch::Change,_std::allocator<Patch::Change>_>::push_back(local_e8,&local_70);
    pNVar15 = local_128;
    pPVar7 = left_ancestor_stack.
             super__Vector_base<Patch::PositionStackEntry,_std::allocator<Patch::PositionStackEntry>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (local_128->right == (Node *)0x0) {
      do {
        left_ancestor_stack.
        super__Vector_base<Patch::PositionStackEntry,_std::allocator<Patch::PositionStackEntry>_>.
        _M_impl.super__Vector_impl_data._M_finish = pPVar7;
        ppNVar13 = local_108._M_impl.super__Vector_impl_data._M_finish + -1;
        pPVar6 = left_ancestor_stack.
                 super__Vector_base<Patch::PositionStackEntry,_std::allocator<Patch::PositionStackEntry>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (local_108._M_impl.super__Vector_impl_data._M_finish ==
            local_108._M_impl.super__Vector_impl_data._M_start) {
          local_128 = (Node *)0x0;
          break;
        }
        local_128 = *ppNVar13;
        bVar8 = local_128->right == pNVar15;
        pNVar15 = local_128;
        local_108._M_impl.super__Vector_impl_data._M_finish = ppNVar13;
        pPVar7 = left_ancestor_stack.
                 super__Vector_base<Patch::PositionStackEntry,_std::allocator<Patch::PositionStackEntry>_>
                 ._M_impl.super__Vector_impl_data._M_finish + -1;
      } while (bVar8);
    }
    else {
      Node::old_text_size(local_128);
      Node::new_text_size(local_128);
      node_old_start = PVar11;
      std::vector<Patch::PositionStackEntry,_std::allocator<Patch::PositionStackEntry>_>::
      emplace_back<Patch::PositionStackEntry>
                (&left_ancestor_stack,(PositionStackEntry *)&node_old_start);
      std::vector<Patch::Node_*,_std::allocator<Patch::Node_*>_>::push_back
                ((vector<Patch::Node_*,_std::allocator<Patch::Node_*>_> *)&local_108,&local_128);
      local_128 = (value_type)&local_128->right;
      while (local_128 = local_128->left,
            pPVar6 = left_ancestor_stack.
                     super__Vector_base<Patch::PositionStackEntry,_std::allocator<Patch::PositionStackEntry>_>
                     ._M_impl.super__Vector_impl_data._M_finish, local_128->left != (Node *)0x0) {
        std::vector<Patch::Node_*,_std::allocator<Patch::Node_*>_>::push_back
                  ((vector<Patch::Node_*,_std::allocator<Patch::Node_*>_> *)&local_108,&local_128);
      }
    }
  } while( true );
}

Assistant:

vector<Patch::Change> Patch::get_changes_in_range(Point start, Point end, bool inclusive) const {
  vector<Change> result;

  Node *node = root;
  vector<Node *> node_stack;
  vector<Patch::PositionStackEntry> left_ancestor_stack{{}};

  Node *found_node = nullptr;
  size_t found_node_ancestor_count = 0;
  size_t found_node_left_ancestor_count = 0;

  while (node) {
    auto &left_ancestor_info = left_ancestor_stack.back();
    Point node_old_start = left_ancestor_info.old_end.traverse(node->old_distance_from_left_ancestor);
    Point node_new_start = left_ancestor_info.new_end.traverse(node->new_distance_from_left_ancestor);
    Point node_old_end = node_old_start.traverse(node->old_extent);
    Point node_new_end = node_new_start.traverse(node->new_extent);

    Point node_end = CoordinateSpace::choose(node_old_end, node_new_end);
    if (node_end > start || (inclusive && node_end == start)) {
      found_node_ancestor_count = node_stack.size();
      found_node_left_ancestor_count = left_ancestor_stack.size();
      found_node = node;
      if (node->left) {
        node_stack.push_back(node);
        node = node->left;
      } else {
        break;
      }
    } else {
      if (node->right) {
        left_ancestor_stack.push_back({
          node_old_end,
          node_new_end,
          left_ancestor_info.total_old_text_size + node->left_subtree_old_text_size() + node->old_text_size(),
          left_ancestor_info.total_new_text_size + node->left_subtree_new_text_size() + node->new_text_size()
        });
        node_stack.push_back(node);
        node = node->right;
      } else {
        break;
      }
    }
  }

  node = found_node;
  node_stack.resize(found_node_ancestor_count);
  left_ancestor_stack.resize(found_node_left_ancestor_count);

  while (node) {
    PositionStackEntry &left_ancestor_info = left_ancestor_stack.back();
    Point old_start = left_ancestor_info.old_end.traverse(
        node->old_distance_from_left_ancestor);
    Point new_start = left_ancestor_info.new_end.traverse(
        node->new_distance_from_left_ancestor);
    Point node_start = CoordinateSpace::choose(old_start, new_start);
    if (node_start > end || (!inclusive && node_start == end)) break;

    Point old_end = old_start.traverse(node->old_extent);
    Point new_end = new_start.traverse(node->new_extent);
    Text *old_text = node->old_text.get();
    Text *new_text = node->new_text.get();
    uint32_t old_text_size = node->old_text_size();
    uint32_t preceding_old_text_size =
      left_ancestor_info.total_old_text_size + node->left_subtree_old_text_size();
    uint32_t preceding_new_text_size =
      left_ancestor_info.total_new_text_size + node->left_subtree_new_text_size();
    Change change{
      old_start,
      old_end,
      new_start,
      new_end,
      old_text,
      new_text,
      preceding_old_text_size,
      preceding_new_text_size,
      old_text_size,
    };
    result.push_back(change);

    if (node->right) {
      left_ancestor_stack.push_back(PositionStackEntry{
        old_end,
        new_end,
        preceding_old_text_size + node->old_text_size(),
        preceding_new_text_size + node->new_text_size()
      });
      node_stack.push_back(node);
      node = node->right;

      while (node->left) {
        node_stack.push_back(node);
        node = node->left;
      }
    } else {
      while (!node_stack.empty() && node_stack.back()->right == node) {
        node = node_stack.back();
        node_stack.pop_back();
        left_ancestor_stack.pop_back();
      }

      if (node_stack.empty()) {
        node = nullptr;
      } else {
        node = node_stack.back();
        node_stack.pop_back();
      }
    }
  }

  return result;
}